

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

void __thiscall
icu_63::ChineseCalendar::roll
          (ChineseCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int local_3c;
  int32_t newM;
  int32_t n;
  int moon1;
  int32_t m;
  int32_t moon;
  int32_t day;
  int32_t dom;
  UErrorCode *status_local;
  int32_t amount_local;
  UCalendarDateFields field_local;
  ChineseCalendar *this_local;
  
  if (field == UCAL_MONTH) {
    if (amount != 0) {
      uVar2 = Calendar::get(&this->super_Calendar,UCAL_DATE,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        iVar3 = Calendar::get(&this->super_Calendar,UCAL_JULIAN_DAY,status);
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 == '\0') {
          uVar4 = (iVar3 - uVar2) - 0x253d8b;
          n = Calendar::get(&this->super_Calendar,UCAL_MONTH,status);
          UVar1 = ::U_FAILURE(*status);
          if (UVar1 == '\0') {
            if ((this->super_Calendar).field_0x262 != '\0') {
              iVar3 = Calendar::get(&this->super_Calendar,UCAL_IS_LEAP_MONTH,status);
              if (iVar3 == 1) {
                n = n + 1;
              }
              else {
                uVar5 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                                  ((double)(int)(uVar4 - (int)(((double)n - 0.5) * 29.530588853)),
                                   this,1);
                iVar6 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x37])
                                  (this,(ulong)uVar5,(ulong)uVar4);
                if ((char)iVar6 != '\0') {
                  n = n + 1;
                }
              }
              UVar1 = ::U_FAILURE(*status);
              if (UVar1 != '\0') {
                return;
              }
            }
            iVar6 = 0xc;
            if ((this->super_Calendar).field_0x262 != '\0') {
              iVar6 = 0xd;
            }
            local_3c = (n + amount) % iVar6;
            if (local_3c < 0) {
              local_3c = iVar6 + local_3c;
            }
            if (local_3c != n) {
              (*(this->super_Calendar).super_UObject._vptr_UObject[0x3a])
                        (this,(ulong)uVar4,(ulong)uVar2,(ulong)(uint)(local_3c - n));
            }
          }
        }
      }
    }
  }
  else {
    Calendar::roll(&this->super_Calendar,field,amount,status);
  }
  return;
}

Assistant:

void ChineseCalendar::roll(UCalendarDateFields field, int32_t amount, UErrorCode& status) {
    switch (field) {
    case UCAL_MONTH:
        if (amount != 0) {
            int32_t dom = get(UCAL_DAY_OF_MONTH, status);
            if (U_FAILURE(status)) break;
            int32_t day = get(UCAL_JULIAN_DAY, status) - kEpochStartAsJulianDay; // Get local day
            if (U_FAILURE(status)) break;
            int32_t moon = day - dom + 1; // New moon (start of this month)

            // Note throughout the following:  Months 12 and 1 are never
            // followed by a leap month (D&R p. 185).

            // Compute the adjusted month number m.  This is zero-based
            // value from 0..11 in a non-leap year, and from 0..12 in a
            // leap year.
            int32_t m = get(UCAL_MONTH, status); // 0-based month
            if (U_FAILURE(status)) break;
            if (isLeapYear) { // (member variable)
                if (get(UCAL_IS_LEAP_MONTH, status) == 1) {
                    ++m;
                } else {
                    // Check for a prior leap month.  (In the
                    // following, month 0 is the first month of the
                    // year.)  Month 0 is never followed by a leap
                    // month, and we know month m is not a leap month.
                    // moon1 will be the start of month 0 if there is
                    // no leap month between month 0 and month m;
                    // otherwise it will be the start of month 1.
                    int moon1 = moon -
                        (int) (CalendarAstronomer::SYNODIC_MONTH * (m - 0.5));
                    moon1 = newMoonNear(moon1, TRUE);
                    if (isLeapMonthBetween(moon1, moon)) {
                        ++m;
                    }
                }
                if (U_FAILURE(status)) break;
            }

            // Now do the standard roll computation on m, with the
            // allowed range of 0..n-1, where n is 12 or 13.
            int32_t n = isLeapYear ? 13 : 12; // Months in this year
            int32_t newM = (m + amount) % n;
            if (newM < 0) {
                newM += n;
            }

            if (newM != m) {
                offsetMonth(moon, dom, newM - m);
            }
        }
        break;
    default:
        Calendar::roll(field, amount, status);
        break;
    }
}